

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

void Emb_ManPrintStats(Emb_Man_t *p)

{
  printf("i/o =%7d/%7d  ",(ulong)(uint)(p->vCis->nSize - p->nRegs),
         (ulong)(uint)(p->vCos->nSize - p->nRegs));
  if (p->nRegs != 0) {
    printf("ff =%7d  ");
  }
  printf("node =%8d  ",(ulong)(uint)(p->nObjs - (p->vCis->nSize + p->vCos->nSize)));
  printf("obj =%8d  ",(ulong)(uint)p->nObjs);
  printf("mem =%5.2f MB",(double)p->nObjData * 4.0 * 9.5367431640625e-07);
  putchar(10);
  return;
}

Assistant:

void Emb_ManPrintStats( Emb_Man_t * p )
{
//    if ( p->pName )
//        printf( "%8s : ", p->pName );
    printf( "i/o =%7d/%7d  ", Emb_ManPiNum(p), Emb_ManPoNum(p) );
    if ( Emb_ManRegNum(p) )
        printf( "ff =%7d  ", Emb_ManRegNum(p) );
    printf( "node =%8d  ", Emb_ManNodeNum(p) );
    printf( "obj =%8d  ", Emb_ManObjNum(p) );
//    printf( "lev =%5d  ", Emb_ManLevelNum(p) );
//    printf( "cut =%5d  ", Emb_ManCrossCut(p) );
    printf( "mem =%5.2f MB", 4.0*p->nObjData/(1<<20) );
//    printf( "obj =%5d  ", Emb_ManObjNum(p) );
    printf( "\n" );

//    Emb_ManSatExperiment( p );
}